

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateManager.cpp
# Opt level: O2

uint64_t __thiscall
helics::MessageFederateManager::pendingMessageCount(MessageFederateManager *this)

{
  _Elt_pointer pEVar1;
  size_t sVar2;
  _Elt_pointer this_00;
  int iVar3;
  _Elt_pointer pEVar4;
  _Map_pointer ppEVar5;
  shared_handle eptDat;
  shared_handle local_40;
  
  gmlc::libguarded::
  shared_guarded_opt<std::deque<helics::MessageFederateManager::EndpointData,_std::allocator<helics::MessageFederateManager::EndpointData>_>,_std::shared_mutex>
  ::lock_shared(&local_40,&this->eptData);
  this_00 = ((local_40.data)->
            super__Deque_base<helics::MessageFederateManager::EndpointData,_std::allocator<helics::MessageFederateManager::EndpointData>_>
            )._M_impl.super__Deque_impl_data._M_start._M_cur;
  pEVar4 = ((local_40.data)->
           super__Deque_base<helics::MessageFederateManager::EndpointData,_std::allocator<helics::MessageFederateManager::EndpointData>_>
           )._M_impl.super__Deque_impl_data._M_start._M_last;
  ppEVar5 = ((local_40.data)->
            super__Deque_base<helics::MessageFederateManager::EndpointData,_std::allocator<helics::MessageFederateManager::EndpointData>_>
            )._M_impl.super__Deque_impl_data._M_start._M_node;
  pEVar1 = ((local_40.data)->
           super__Deque_base<helics::MessageFederateManager::EndpointData,_std::allocator<helics::MessageFederateManager::EndpointData>_>
           )._M_impl.super__Deque_impl_data._M_finish._M_cur;
  iVar3 = 0;
  while (this_00 != pEVar1) {
    sVar2 = gmlc::containers::
            SimpleQueue<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::mutex>
            ::size(&this_00->messages);
    iVar3 = iVar3 + (int)sVar2;
    this_00 = this_00 + 1;
    if (this_00 == pEVar4) {
      this_00 = ppEVar5[1];
      ppEVar5 = ppEVar5 + 1;
      pEVar4 = this_00 + 3;
    }
  }
  std::shared_lock<std::shared_mutex>::~shared_lock(&local_40.m_handle_lock);
  return (long)iVar3;
}

Assistant:

uint64_t MessageFederateManager::pendingMessageCount() const
{
    auto eptDat = eptData.lock_shared();
    return std::accumulate(eptDat.begin(), eptDat.end(), 0, [](uint64_t count, const auto& ept) {
        return count + static_cast<uint64_t>(ept.messages.size());
    });
    /*
    uint64_t size{ 0 };
    for (const auto& mq : eptDat) {
        size = size + mq.messages.size();
    }
    return size;
    */
}